

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::BuildVectorOfTable(FieldDef *field,string *code_ptr)

{
  bool bVar1;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  string local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  Type local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  Type local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_t local_50;
  size_t elem_size;
  size_t alignment;
  Type vector_type;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  
  vector_type._24_8_ = code_ptr;
  Type::VectorType((Type *)&alignment,&(field->value).type);
  elem_size = InlineAlignment((Type *)&alignment);
  local_50 = InlineSize((Type *)&alignment);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param array offset array\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return int vector offset\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public static function create");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  ConvertCase(&local_140,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::operator+=
            ((string *)vector_type._24_8_,"Vector(FlatBufferBuilder $builder, array $data)\n");
  std::operator+(&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::operator+(&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_180,&local_1a0,"$builder->startVector(");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  NumToString<unsigned_long>(&local_1c0,local_50);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  NumToString<unsigned_long>(&local_200,elem_size);
  std::operator+(&local_1e0,", count($data), ",&local_200);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,");\n");
  std::operator+(&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::operator+=
            ((string *)vector_type._24_8_,"for ($i = count($data) - 1; $i >= 0; $i--) {\n");
  Type::VectorType(&local_240,&(field->value).type);
  bVar1 = IsScalar(local_240.base_type);
  if (bVar1) {
    std::operator+(&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_260,&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::operator+=((string *)vector_type._24_8_,"$builder->put");
    Type::VectorType(&local_2e0,&(field->value).type);
    GenTypeBasic_abi_cxx11_(&local_2c0,(PhpGenerator *)&local_2e0,type);
    ConvertCase(&local_2a0,&local_2c0,kUpperCamel,kSnake);
    std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::operator+=((string *)vector_type._24_8_,"($data[$i]);\n");
  }
  else {
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_300,&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::operator+=
              ((string *)vector_type._24_8_,"$builder->putOffset($data[$i]);\n");
  }
  std::operator+(&local_360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_340,&local_360,"}\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::operator+(&local_3a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_380,&local_3a0,"return $builder->endVector();\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::operator+(&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::operator+(&local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::operator+(&local_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::operator+(&local_420,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param int $numElems\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::operator+(&local_440,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return void\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::operator+(&local_460,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::operator+(&local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public static function start");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  ConvertCase(&local_4a0,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::operator+=
            ((string *)vector_type._24_8_,"Vector(FlatBufferBuilder $builder, $numElems)\n");
  std::operator+(&local_4c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::operator+(&local_500,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_4e0,&local_500,"$builder->startVector(");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  NumToString<unsigned_long>(&local_520,local_50);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  NumToString<unsigned_long>(&local_560,elem_size);
  std::operator+(&local_540,", $numElems, ",&local_560);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,");\n");
  std::operator+(&local_580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)vector_type._24_8_,(string *)&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  return;
}

Assistant:

static void BuildVectorOfTable(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    auto vector_type = field.value.type.VectorType();
    auto alignment = InlineAlignment(vector_type);
    auto elem_size = InlineSize(vector_type);
    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param array offset array\n";
    code += Indent + " * @return int vector offset\n";
    code += Indent + " */\n";
    code += Indent + "public static function create";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "Vector(FlatBufferBuilder $builder, array $data)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->startVector(";
    code += NumToString(elem_size);
    code += ", count($data), " + NumToString(alignment);
    code += ");\n";
    code += Indent + Indent;
    code += "for ($i = count($data) - 1; $i >= 0; $i--) {\n";
    if (IsScalar(field.value.type.VectorType().base_type)) {
      code += Indent + Indent + Indent;
      code += "$builder->put";
      code += ConvertCase(GenTypeBasic(field.value.type.VectorType()),
                          Case::kUpperCamel);
      code += "($data[$i]);\n";
    } else {
      code += Indent + Indent + Indent;
      code += "$builder->putOffset($data[$i]);\n";
    }
    code += Indent + Indent + "}\n";
    code += Indent + Indent + "return $builder->endVector();\n";
    code += Indent + "}\n\n";

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param int $numElems\n";
    code += Indent + " * @return void\n";
    code += Indent + " */\n";
    code += Indent + "public static function start";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "Vector(FlatBufferBuilder $builder, $numElems)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->startVector(";
    code += NumToString(elem_size);
    code += ", $numElems, " + NumToString(alignment);
    code += ");\n";
    code += Indent + "}\n\n";
  }